

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O2

int sha1_result(sha1_context *context,uint8_t *Message_Digest)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint_fast8_t i;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint8_t uVar7;
  short sVar8;
  byte bVar9;
  
  if (Message_Digest != (uint8_t *)0x0 && context != (sha1_context *)0x0) {
    iVar4 = context->corrupted;
    if (iVar4 == 0) {
      if (context->computed == 0) {
        uVar5 = (ulong)context->message_block_index;
        sVar8 = context->message_block_index + 1;
        context->message_block_index = sVar8;
        if ((long)uVar5 < 0x38) {
          uVar7 = 0x80;
          while( true ) {
            context->message_block[(short)uVar5] = uVar7;
            uVar1 = context->message_block_index;
            uVar5 = (ulong)uVar1;
            if (0x37 < (short)uVar1) break;
            context->message_block_index = uVar1 + 1;
            uVar7 = '\0';
          }
        }
        else {
          context->message_block[uVar5] = 0x80;
          while (sVar8 < 0x40) {
            context->message_block_index = sVar8 + 1;
            context->message_block[sVar8] = '\0';
            sVar8 = context->message_block_index;
          }
          sha1_process_message_block(context);
          while( true ) {
            sVar8 = context->message_block_index;
            if (0x37 < (long)sVar8) break;
            context->message_block_index = sVar8 + 1;
            context->message_block[sVar8] = '\0';
          }
        }
        uVar2 = context->length_low;
        uVar3 = context->length_high;
        *(uint *)(context->message_block + 0x38) =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        *(uint *)(context->message_block + 0x3c) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        sha1_process_message_block(context);
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 1) {
          context->message_block[lVar6] = '\0';
        }
        context->length_low = 0;
        context->length_high = 0;
        context->computed = 1;
      }
      iVar4 = 0;
      bVar9 = 0;
      for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 1) {
        Message_Digest[lVar6] =
             (uint8_t)(*(uint *)((long)context->intermediate_hash +
                                (ulong)((uint)lVar6 & 0xfffffffc)) >> (~bVar9 & 0x18));
        bVar9 = bVar9 + 8;
      }
    }
    return iVar4;
  }
  return 1;
}

Assistant:

int sha1_result(sha1_context *context,
                uint8_t Message_Digest[SHA1_HASH_SIZE])
{
	if ((!context) || (!Message_Digest)) {
		return SHA_NULL;
	}

	if (context->corrupted) {
		return context->corrupted;
	}

	if (!context->computed) {
		sha1_pad_message(context);
		for (uint_fast8_t i = 0; i < 64; ++i) {
			/* message may be sensitive, clear it out */
			context->message_block[i] = 0;
		}
		context->length_low = 0; /* and clear length */
		context->length_high = 0;
		context->computed = 1;
	}

	for (uint_fast8_t i = 0; i < SHA1_HASH_SIZE; ++i) {
		Message_Digest[i] = (uint8_t)(context->intermediate_hash[i >> 2U] >> 8 * (3 - (i & 0x03U)));
	}

	return SHA_SUCCESS;
}